

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alteration_notifier.h
# Opt level: O1

void __thiscall
lemon::
AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::
attach(AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
       *this,ObserverBase *observer)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)observer;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->_observers).
            super__List_base<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*,_std::allocator<lemon::AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>::ObserverBase_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  (observer->_index)._M_node = p_Var2;
  observer->_notifier = this;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
  return;
}

Assistant:

void attach(ObserverBase& observer) {
    _lock.lock();
    observer._index    = _observers.insert(_observers.begin(), &observer);
    observer._notifier = this;
    _lock.unlock();
  }